

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_cmp_abs(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  ulong local_30;
  size_t j;
  size_t i;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  for (j = X->n; (j != 0 && (X->p[j - 1] == 0)); j = j - 1) {
  }
  for (local_30 = Y->n; (local_30 != 0 && (Y->p[local_30 - 1] == 0)); local_30 = local_30 - 1) {
  }
  if ((j == 0) && (local_30 == 0)) {
    X_local._4_4_ = 0;
  }
  else if (local_30 < j) {
    X_local._4_4_ = 1;
  }
  else if (j < local_30) {
    X_local._4_4_ = -1;
  }
  else {
    for (; j != 0; j = j - 1) {
      if (Y->p[j - 1] < X->p[j - 1]) {
        return 1;
      }
      if (X->p[j - 1] < Y->p[j - 1]) {
        return -1;
      }
    }
    X_local._4_4_ = 0;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_cmp_abs( const mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    size_t i, j;

    for( i = X->n; i > 0; i-- )
        if( X->p[i - 1] != 0 )
            break;

    for( j = Y->n; j > 0; j-- )
        if( Y->p[j - 1] != 0 )
            break;

    if( i == 0 && j == 0 )
        return( 0 );

    if( i > j ) return(  1 );
    if( j > i ) return( -1 );

    for( ; i > 0; i-- )
    {
        if( X->p[i - 1] > Y->p[i - 1] ) return(  1 );
        if( X->p[i - 1] < Y->p[i - 1] ) return( -1 );
    }

    return( 0 );
}